

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dagify.cpp
# Opt level: O0

void __thiscall handlegraph::algorithms::SubHandleGraph::follow_edges_impl(SubHandleGraph *this)

{
  function<bool_(const_handlegraph::handle_t_&)> *in_stack_00000028;
  bool in_stack_00000037;
  handle_t *in_stack_00000038;
  SubHandleGraph *in_stack_00000040;
  
  follow_edges_impl(in_stack_00000040,in_stack_00000038,in_stack_00000037,in_stack_00000028);
  return;
}

Assistant:

bool SubHandleGraph::follow_edges_impl(const handle_t& handle, bool go_left, const function<bool(const handle_t&)>& iteratee) const {
    // only let it travel along edges whose endpoints are in the subgraph
    bool keep_going = true;
    super->follow_edges(handle, go_left, [&](const handle_t& handle) {
        if (contents.count(super->get_id(handle))) {
            keep_going = iteratee(handle);
        }
        return keep_going;
    });
    return keep_going;
}